

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O3

void __thiscall
duckdb::roaring::ContainerMetadataCollection::AddArrayContainer
          (ContainerMetadataCollection *this,idx_t amount,bool is_inverted)

{
  pointer *ppuVar1;
  iterator __position;
  undefined1 in_AL;
  uchar uVar2;
  undefined7 in_register_00000001;
  undefined8 uStack_18;
  
  uStack_18 = CONCAT71(in_register_00000001,in_AL);
  AddContainerType(this,false,is_inverted);
  uVar2 = NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(amount);
  uStack_18 = CONCAT17(uVar2,(undefined7)uStack_18);
  __position._M_current =
       (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&(this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
               __position,(uchar *)((long)&uStack_18 + 7));
  }
  else {
    *__position._M_current = uVar2;
    ppuVar1 = &(this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  this->arrays_in_segment = this->arrays_in_segment + 1;
  this->count_in_segment = this->count_in_segment + 1;
  return;
}

Assistant:

void ContainerMetadataCollection::AddArrayContainer(idx_t amount, bool is_inverted) {
	AddContainerType(false, is_inverted);
	D_ASSERT(amount < MAX_ARRAY_IDX);
	cardinality.push_back(NumericCast<uint8_t>(amount));
	arrays_in_segment++;
	count_in_segment++;
}